

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void check_const_expr_invoker(void)

{
  undefined1 *puVar1;
  undefined1 local_1e8 [376];
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  undefined7 uStack_4f;
  undefined1 local_40 [16];
  
  memset((ostringstream *)local_1e8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  local_68 = 0;
  local_60[0] = 0;
  local_50 = (string)0x22;
  local_70 = local_60;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"check_const_expr",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,&local_50);
  if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
  }
  puVar1 = local_70;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5d;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  memset((ostringstream *)local_1e8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  local_68 = 0;
  local_60[0] = 0;
  local_50 = (string)0x22;
  local_70 = local_60;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"check_const_expr",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,&local_50);
  if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
  }
  puVar1 = local_70;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5d;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  memset((ostringstream *)local_1e8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  local_68 = 0;
  local_60[0] = 0;
  local_50 = (string)0x22;
  local_70 = local_60;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"check_const_expr",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,&local_50);
  if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
  }
  puVar1 = local_70;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5d;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  memset((ostringstream *)local_1e8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  local_68 = 0;
  local_60[0] = 0;
  local_50 = (string)0x22;
  local_70 = local_60;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"check_const_expr",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,&local_50);
  if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
  }
  puVar1 = local_70;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5d;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  memset((ostringstream *)local_1e8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  local_68 = 0;
  local_60[0] = 0;
  local_50 = (string)0x22;
  local_70 = local_60;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"check_const_expr",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,&local_50);
  if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
  }
  puVar1 = local_70;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5d;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( check_const_expr )
{
    static constexpr const char* c = "test";
    force_const< ah::file_base( c, 1 ) - c >();
    force_const< ah::file_hash< unsigned >( c ) >();
    force_const< ah::file_and_line_hash< std::uint16_t >( __FILE__, __LINE__ ) >();
}